

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_mul_mips(float32 a,float32 b,float_status *s)

{
  _Bool _Var1;
  byte bVar2;
  float32 fVar3;
  ulong uVar4;
  union_float32 a_00;
  float_status *s_local;
  float32 b_local;
  float32 a_local;
  union_float32 ur;
  union_float32 ub;
  union_float32 ua;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  code *local_28;
  float_status *local_20;
  float32 local_14;
  float32 local_10;
  
  local_28 = hard_f32_mul;
  local_30 = soft_f32_mul;
  local_38 = f32_is_zon2;
  local_40 = (code *)0x0;
  local_48 = f32_mul_fast_test;
  _ub = f32_mul_fast_op;
  a_local = b;
  ur.s = a;
  local_20 = s;
  local_14 = b;
  local_10 = a;
  _Var1 = can_use_fpu(s);
  if (((_Var1 ^ 0xffU) & 1) == 0) {
    float32_input_flush2(&ur.s,&a_local,local_20);
    bVar2 = (*local_38)(ur.s,a_local);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      if ((local_48 != (code *)0x0) && (uVar4 = (*local_48)(ur.s,a_local), (uVar4 & 1) != 0)) {
        fVar3 = (*_ub)(ur.s,a_local,local_20);
        return fVar3;
      }
      a_00.s = (*local_28)(ur.s);
      _Var1 = f32_is_inf(a_00);
      if (_Var1) {
        local_20->float_exception_flags = local_20->float_exception_flags | 8;
        return a_00.s;
      }
      if (1.1754944e-38 < (float)(a_00.s & (uint)DAT_0135ca80)) {
        return a_00.s;
      }
      if ((local_40 != (code *)0x0) && (uVar4 = (*local_40)(ur.s,a_local), (uVar4 & 1) == 0)) {
        return a_00.s;
      }
    }
  }
  fVar3 = (*local_30)(ur.s,a_local,local_20);
  return fVar3;
}

Assistant:

float32 QEMU_FLATTEN
float32_mul(float32 a, float32 b, float_status *s)
{
    return float32_gen2(a, b, s, hard_f32_mul, soft_f32_mul,
                        f32_is_zon2, NULL, f32_mul_fast_test, f32_mul_fast_op);
}